

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void GC::CheckArray(char *ptr,ExternTypeInfo *type)

{
  if ((type->field_8).arrSize == 0xffffffff) {
    if (*(long *)ptr != 0) {
      CheckPointer(ptr);
      return;
    }
    return;
  }
  if ((type->field_11).subType < *(uint *)(NULLC::commonLinker + 0x20c)) {
    CheckArrayElements(ptr,(type->field_8).arrSize,
                       (ExternTypeInfo *)
                       ((ulong)(type->field_11).subType * 0x50 +
                       *(long *)(NULLC::commonLinker + 0x200)));
    return;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void CheckArray(char* ptr, const ExternTypeInfo& type)
	{
		// If array type is an unsized array, check pointer that points to actual array contents
		if(type.arrSize == ~0u)
		{
			NULLCArray *data = (NULLCArray*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			CheckPointer((char*)&data->ptr);
		}
		else
		{
			// Get array element type
			ExternTypeInfo *subType = &NULLC::commonLinker->exTypes[type.subType];

			CheckArrayElements(ptr, type.arrSize, *subType);
		}
	}